

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall icu_63::ReorderingBuffer::insert(ReorderingBuffer *this,UChar32 c,uint8_t cc)

{
  UChar *pUVar1;
  byte bVar2;
  ulong uVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar32 UVar6;
  
  this->codePointStart = this->limit;
  skipPrevious(this);
  do {
    bVar2 = previousCC(this);
  } while (cc < bVar2);
  pUVar5 = this->limit;
  uVar3 = -(ulong)((uint)c < 0x10000) + 2;
  pUVar1 = this->codePointLimit;
  this->limit = pUVar5 + (uVar3 & 0xffffffff);
  do {
    pUVar4 = pUVar5;
    pUVar4[-(ulong)((uint)c < 0x10000) + 1] = pUVar4[-1];
    pUVar5 = pUVar4 + -1;
  } while (pUVar5 != pUVar1);
  UVar6 = c;
  if (0xffff < c) {
    UVar6 = ((uint)c >> 10) - 0x2840;
    *pUVar4 = (ushort)c & 0x3ff | 0xdc00;
  }
  *pUVar5 = (UChar)UVar6;
  if (cc < 2) {
    this->reorderStart = pUVar5 + uVar3;
  }
  return;
}

Assistant:

void ReorderingBuffer::insert(UChar32 c, uint8_t cc) {
    for(setIterator(), skipPrevious(); previousCC()>cc;) {}
    // insert c at codePointLimit, after the character with prevCC<=cc
    UChar *q=limit;
    UChar *r=limit+=U16_LENGTH(c);
    do {
        *--r=*--q;
    } while(codePointLimit!=q);
    writeCodePoint(q, c);
    if(cc<=1) {
        reorderStart=r;
    }
}